

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

void calc_mean_and_sd<double,unsigned_long,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,double *x_sd,double *x_mean)

{
  long in_RDX;
  long in_RSI;
  double dVar1;
  double *in_stack_00000010;
  unsigned_long *in_stack_000000a8;
  double *in_stack_000000b0;
  size_t in_stack_000000b8;
  size_t in_stack_000000c0;
  size_t in_stack_000000c8;
  size_t *in_stack_000000d0;
  unsigned_long *in_stack_000000e0;
  double *in_stack_000000e8;
  double *in_stack_000000f0;
  
  if ((in_RDX - in_RSI) + 1U < 1000000) {
    calc_mean_and_sd_<double,unsigned_long,double>
              (ix_arr,st,end,col_num,Xc,Xc_ind,Xc_indptr,x_sd,x_mean);
  }
  else {
    calc_mean_and_sd_<double,unsigned_long,long_double>
              (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
               in_stack_000000b0,in_stack_000000a8,in_stack_000000e0,in_stack_000000e8,
               in_stack_000000f0);
  }
  dVar1 = *in_stack_00000010;
  if (dVar1 <= 1e-10) {
    dVar1 = 1e-10;
  }
  *in_stack_00000010 = dVar1;
  return;
}

Assistant:

void calc_mean_and_sd(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                      real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                      double &restrict x_sd, double &restrict x_mean)
{
    if (end - st + 1 < THRESHOLD_LONG_DOUBLE)
        calc_mean_and_sd_<real_t_, sparse_ix, double>(ix_arr, st, end, col_num, Xc, Xc_ind, Xc_indptr, x_sd, x_mean);
    else
        calc_mean_and_sd_<real_t_, sparse_ix, ldouble_safe>(ix_arr, st, end, col_num, Xc, Xc_ind, Xc_indptr, x_sd, x_mean);
    x_sd = std::fmax(SD_MIN, x_sd);
}